

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_encoder_mt.c
# Opt level: O0

lzma_ret stream_encode_mt(void *coder_ptr,lzma_allocator *allocator,uint8_t *in,size_t *in_pos,
                         size_t in_size,uint8_t *out,size_t *out_pos,size_t out_size,
                         lzma_action action)

{
  bool bVar1;
  _Bool _Var2;
  lzma_ret lVar3;
  lzma_vli lVar4;
  lzma_ret ret_1;
  lzma_ret ret_;
  uint mythread_j_698;
  uint mythread_i_698;
  mythread_condtime wait_abs;
  _Bool has_blocked;
  lzma_vli lStack_58;
  lzma_ret ret;
  lzma_vli uncompressed_size;
  lzma_vli unpadded_size;
  lzma_stream_coder_conflict1 *coder;
  uint8_t *out_local;
  size_t in_size_local;
  size_t *in_pos_local;
  uint8_t *in_local;
  lzma_allocator *allocator_local;
  void *coder_ptr_local;
  
  unpadded_size = (lzma_vli)coder_ptr;
  coder = (lzma_stream_coder_conflict1 *)out;
  out_local = (uint8_t *)in_size;
  in_size_local = (size_t)in_pos;
  in_pos_local = (size_t *)in;
  in_local = (uint8_t *)allocator;
  allocator_local = (lzma_allocator *)coder_ptr;
  switch(*coder_ptr) {
  case 0:
    lzma_bufcpy((uint8_t *)((long)coder_ptr + 0xe8),(size_t *)((long)coder_ptr + 0xf8),0xc,out,
                out_pos,out_size);
    if (*(ulong *)(unpadded_size + 0xf8) < 0xc) {
      return LZMA_OK;
    }
    *(undefined8 *)(unpadded_size + 0xf8) = 0;
    *(undefined4 *)unpadded_size = 1;
  case 1:
    uncompressed_size = 0;
    lStack_58 = 0;
    wait_abs.tv_nsec._4_4_ = LZMA_OK;
    wait_abs.tv_nsec._3_1_ = 0;
    do {
      do {
        bVar1 = false;
        while (!bVar1) {
          mythread_mutex_lock((mythread_mutex *)(unpadded_size + 0x168));
          bVar1 = false;
          while (!bVar1) {
            wait_abs.tv_nsec._4_4_ = *(lzma_ret *)(unpadded_size + 0x134);
            if (wait_abs.tv_nsec._4_4_ != LZMA_OK) {
              if (wait_abs.tv_nsec._4_4_ == LZMA_STREAM_END) {
                __assert_fail("ret != LZMA_STREAM_END",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                              ,0x2be,
                              "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                             );
              }
              break;
            }
            wait_abs.tv_nsec._4_4_ =
                 lzma_outq_read((lzma_outq *)(unpadded_size + 0x100),(uint8_t *)coder,out_pos,
                                out_size,&uncompressed_size,&stack0xffffffffffffffa8);
            bVar1 = true;
          }
          bVar1 = true;
        }
        mythread_mutex_unlock((mythread_mutex *)(unpadded_size + 0x168));
      } while ((wait_abs.tv_nsec._4_4_ == LZMA_STREAM_END) &&
              (wait_abs.tv_nsec._4_4_ =
                    lzma_index_append(*(lzma_index **)(unpadded_size + 0x60),
                                      (lzma_allocator *)in_local,uncompressed_size,lStack_58),
              *out_pos < out_size));
      if (wait_abs.tv_nsec._4_4_ != LZMA_OK) {
        threads_stop((lzma_stream_coder_conflict1 *)unpadded_size,false);
        return wait_abs.tv_nsec._4_4_;
      }
      wait_abs.tv_nsec._4_4_ =
           stream_encode_in((lzma_stream_coder_conflict1 *)unpadded_size,(lzma_allocator *)in_local,
                            (uint8_t *)in_pos_local,(size_t *)in_size_local,(size_t)out_local,action
                           );
      if (wait_abs.tv_nsec._4_4_ != LZMA_OK) {
        threads_stop((lzma_stream_coder_conflict1 *)unpadded_size,false);
        return wait_abs.tv_nsec._4_4_;
      }
      if (*(uint8_t **)in_size_local == out_local) {
        if (action == LZMA_RUN) {
          return LZMA_OK;
        }
        if (action == LZMA_FULL_BARRIER) {
          return LZMA_STREAM_END;
        }
        _Var2 = lzma_outq_is_empty((lzma_outq *)(unpadded_size + 0x100));
        if (_Var2) {
          if (action == LZMA_FINISH) {
            lVar3 = lzma_index_encoder_init
                              ((lzma_next_coder *)(unpadded_size + 0x68),(lzma_allocator *)in_local,
                               *(lzma_index **)(unpadded_size + 0x60));
            if (lVar3 != LZMA_OK) {
              return lVar3;
            }
            *(undefined4 *)unpadded_size = 2;
            lVar4 = lzma_index_size(*(lzma_index **)(unpadded_size + 0x60));
            *(lzma_vli *)(unpadded_size + 0x160) = lVar4 + 0xc + *(long *)(unpadded_size + 0x160);
            goto switchD_002293dc_caseD_2;
          }
          if (action == LZMA_FULL_FLUSH) {
            return LZMA_STREAM_END;
          }
        }
      }
      if (*out_pos == out_size) {
        return LZMA_OK;
      }
      _Var2 = wait_for_work((lzma_stream_coder_conflict1 *)unpadded_size,
                            (mythread_condtime *)&mythread_j_698,
                            (_Bool *)((long)&wait_abs.tv_nsec + 3),
                            *(uint8_t **)in_size_local < out_local);
    } while (!_Var2);
    coder_ptr_local._4_4_ = 0x20;
    break;
  case 2:
switchD_002293dc_caseD_2:
    lVar3 = (**(code **)(unpadded_size + 0x80))
                      (*(undefined8 *)(unpadded_size + 0x68),in_local,0,0,0,coder,out_pos,out_size,0
                      );
    if (lVar3 != LZMA_STREAM_END) {
      return lVar3;
    }
    lVar4 = lzma_index_size(*(lzma_index **)(unpadded_size + 0x60));
    *(lzma_vli *)(unpadded_size + 0xb8) = lVar4;
    lVar3 = lzma_stream_footer_encode
                      ((lzma_stream_flags *)(unpadded_size + 0xb0),(uint8_t *)(unpadded_size + 0xe8)
                      );
    if (lVar3 != LZMA_OK) {
      return LZMA_PROG_ERROR;
    }
    *(undefined4 *)unpadded_size = 3;
  case 3:
    lzma_bufcpy((uint8_t *)(unpadded_size + 0xe8),(size_t *)(unpadded_size + 0xf8),0xc,
                (uint8_t *)coder,out_pos,out_size);
    coder_ptr_local._4_4_ = (lzma_ret)(0xb < *(ulong *)(unpadded_size + 0xf8));
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmliblzma/liblzma/common/stream_encoder_mt.c"
                  ,0x343,
                  "lzma_ret stream_encode_mt(void *, const lzma_allocator *, const uint8_t *restrict, size_t *restrict, size_t, uint8_t *restrict, size_t *restrict, size_t, lzma_action)"
                 );
  }
  return coder_ptr_local._4_4_;
}

Assistant:

static lzma_ret
stream_encode_mt(void *coder_ptr, const lzma_allocator *allocator,
		const uint8_t *restrict in, size_t *restrict in_pos,
		size_t in_size, uint8_t *restrict out,
		size_t *restrict out_pos, size_t out_size, lzma_action action)
{
	lzma_stream_coder *coder = coder_ptr;

	switch (coder->sequence) {
	case SEQ_STREAM_HEADER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		if (coder->header_pos < sizeof(coder->header))
			return LZMA_OK;

		coder->header_pos = 0;
		coder->sequence = SEQ_BLOCK;

	// Fall through

	case SEQ_BLOCK: {
		// Initialized to silence warnings.
		lzma_vli unpadded_size = 0;
		lzma_vli uncompressed_size = 0;
		lzma_ret ret = LZMA_OK;

		// These are for wait_for_work().
		bool has_blocked = false;
		mythread_condtime wait_abs;

		while (true) {
			mythread_sync(coder->mutex) {
				// Check for Block encoder errors.
				ret = coder->thread_error;
				if (ret != LZMA_OK) {
					assert(ret != LZMA_STREAM_END);
					break; // Break out of mythread_sync.
				}

				// Try to read compressed data to out[].
				ret = lzma_outq_read(&coder->outq,
						out, out_pos, out_size,
						&unpadded_size,
						&uncompressed_size);
			}

			if (ret == LZMA_STREAM_END) {
				// End of Block. Add it to the Index.
				ret = lzma_index_append(coder->index,
						allocator, unpadded_size,
						uncompressed_size);

				// If we didn't fill the output buffer yet,
				// try to read more data. Maybe the next
				// outbuf has been finished already too.
				if (*out_pos < out_size)
					continue;
			}

			if (ret != LZMA_OK) {
				// coder->thread_error was set or
				// lzma_index_append() failed.
				threads_stop(coder, false);
				return ret;
			}

			// Try to give uncompressed data to a worker thread.
			ret = stream_encode_in(coder, allocator,
					in, in_pos, in_size, action);
			if (ret != LZMA_OK) {
				threads_stop(coder, false);
				return ret;
			}

			// See if we should wait or return.
			//
			// TODO: LZMA_SYNC_FLUSH and LZMA_SYNC_BARRIER.
			if (*in_pos == in_size) {
				// LZMA_RUN: More data is probably coming
				// so return to let the caller fill the
				// input buffer.
				if (action == LZMA_RUN)
					return LZMA_OK;

				// LZMA_FULL_BARRIER: The same as with
				// LZMA_RUN but tell the caller that the
				// barrier was completed.
				if (action == LZMA_FULL_BARRIER)
					return LZMA_STREAM_END;

				// Finishing or flushing isn't completed until
				// all input data has been encoded and copied
				// to the output buffer.
				if (lzma_outq_is_empty(&coder->outq)) {
					// LZMA_FINISH: Continue to encode
					// the Index field.
					if (action == LZMA_FINISH)
						break;

					// LZMA_FULL_FLUSH: Return to tell
					// the caller that flushing was
					// completed.
					if (action == LZMA_FULL_FLUSH)
						return LZMA_STREAM_END;
				}
			}

			// Return if there is no output space left.
			// This check must be done after testing the input
			// buffer, because we might want to use a different
			// return code.
			if (*out_pos == out_size)
				return LZMA_OK;

			// Neither in nor out has been used completely.
			// Wait until there's something we can do.
			if (wait_for_work(coder, &wait_abs, &has_blocked,
					*in_pos < in_size))
				return LZMA_TIMED_OUT;
		}

		// All Blocks have been encoded and the threads have stopped.
		// Prepare to encode the Index field.
		return_if_error(lzma_index_encoder_init(
				&coder->index_encoder, allocator,
				coder->index));
		coder->sequence = SEQ_INDEX;

		// Update the progress info to take the Index and
		// Stream Footer into account. Those are very fast to encode
		// so in terms of progress information they can be thought
		// to be ready to be copied out.
		coder->progress_out += lzma_index_size(coder->index)
				+ LZMA_STREAM_HEADER_SIZE;
	}

	// Fall through

	case SEQ_INDEX: {
		// Call the Index encoder. It doesn't take any input, so
		// those pointers can be NULL.
		const lzma_ret ret = coder->index_encoder.code(
				coder->index_encoder.coder, allocator,
				NULL, NULL, 0,
				out, out_pos, out_size, LZMA_RUN);
		if (ret != LZMA_STREAM_END)
			return ret;

		// Encode the Stream Footer into coder->buffer.
		coder->stream_flags.backward_size
				= lzma_index_size(coder->index);
		if (lzma_stream_footer_encode(&coder->stream_flags,
				coder->header) != LZMA_OK)
			return LZMA_PROG_ERROR;

		coder->sequence = SEQ_STREAM_FOOTER;
	}

	// Fall through

	case SEQ_STREAM_FOOTER:
		lzma_bufcpy(coder->header, &coder->header_pos,
				sizeof(coder->header),
				out, out_pos, out_size);
		return coder->header_pos < sizeof(coder->header)
				? LZMA_OK : LZMA_STREAM_END;
	}

	assert(0);
	return LZMA_PROG_ERROR;
}